

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_both.cc
# Opt level: O0

ssl_private_key_result_t bssl::tls13_add_certificate_verify(SSL_HANDSHAKE *hs)

{
  StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *this;
  uint16_t sigalg;
  SSL *ssl_00;
  _func_bool_SSL_ptr_CBB_ptr_CBB_ptr_uint8_t *p_Var1;
  Span<const_unsigned_char> in;
  uint8_t *max_out;
  bool bVar2;
  int iVar3;
  cbb_st *pcVar4;
  pointer psVar5;
  EVP_PKEY *pkey;
  uchar *local_100;
  size_t sStack_f8;
  ssl_private_key_result_t local_ec;
  undefined1 local_e8 [4];
  ssl_private_key_result_t sign_result;
  Array<unsigned_char> msg;
  size_t sig_len;
  uint8_t *sig;
  size_t max_sig_len;
  CBB child;
  undefined1 local_80 [8];
  CBB body;
  ScopedCBB cbb;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  
  ssl_00 = hs->ssl;
  if (hs->signature_algorithm == 0) {
    __assert_fail("hs->signature_algorithm != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                  ,0x246,
                  "enum ssl_private_key_result_t bssl::tls13_add_certificate_verify(SSL_HANDSHAKE *)"
                 );
  }
  this = (StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body.u + 0x18);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated(this);
  p_Var1 = ssl_00->method->init_message;
  pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get(this);
  bVar2 = (*p_Var1)(ssl_00,pcVar4,(CBB *)local_80,'\x0f');
  if ((!bVar2) || (iVar3 = CBB_add_u16((CBB *)local_80,hs->signature_algorithm), iVar3 == 0)) {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                  ,0x24c);
    hs_local._4_4_ = ssl_private_key_failure;
    child.u._24_4_ = 1;
    goto LAB_00398285;
  }
  psVar5 = std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::operator->(&hs->credential);
  pkey = (EVP_PKEY *)std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get(&psVar5->pubkey);
  iVar3 = EVP_PKEY_size(pkey);
  sig = (uint8_t *)(long)iVar3;
  iVar3 = CBB_add_u16_length_prefixed((CBB *)local_80,(CBB *)&max_sig_len);
  if ((iVar3 == 0) ||
     (iVar3 = CBB_reserve((CBB *)&max_sig_len,(uint8_t **)&sig_len,(size_t)sig), iVar3 == 0)) {
    ssl_send_alert(ssl_00,2,0x50);
    hs_local._4_4_ = ssl_private_key_failure;
    child.u._24_4_ = 1;
    goto LAB_00398285;
  }
  Array<unsigned_char>::Array((Array<unsigned_char> *)local_e8);
  bVar2 = tls13_get_cert_verify_signature_input
                    (hs,(Array<unsigned_char> *)local_e8,
                     (byte)~ssl_00->field_0xa4 & ssl_cert_verify_client);
  max_out = sig;
  if (bVar2) {
    sigalg = hs->signature_algorithm;
    Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
              ((Span<unsigned_char_const> *)&local_100,(Array<unsigned_char> *)local_e8);
    in.size_ = sStack_f8;
    in.data_ = local_100;
    local_ec = ssl_private_key_sign(hs,(uint8_t *)sig_len,&msg.size_,(size_t)max_out,sigalg,in);
    hs_local._4_4_ = local_ec;
    if (local_ec == ssl_private_key_success) {
      iVar3 = CBB_did_write((CBB *)&max_sig_len,msg.size_);
      if (iVar3 != 0) {
        pcVar4 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                            ((long)&body.u + 0x18));
        bVar2 = ssl_add_message_cbb(ssl_00,pcVar4);
        if (bVar2) {
          hs_local._4_4_ = ssl_private_key_success;
          goto LAB_00398279;
        }
      }
      hs_local._4_4_ = ssl_private_key_failure;
    }
  }
  else {
    ssl_send_alert(ssl_00,2,0x50);
    hs_local._4_4_ = ssl_private_key_failure;
  }
LAB_00398279:
  child.u._24_4_ = 1;
  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_e8);
LAB_00398285:
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)((long)&body.u + 0x18));
  return hs_local._4_4_;
}

Assistant:

enum ssl_private_key_result_t tls13_add_certificate_verify(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  assert(hs->signature_algorithm != 0);
  ScopedCBB cbb;
  CBB body;
  if (!ssl->method->init_message(ssl, cbb.get(), &body,
                                 SSL3_MT_CERTIFICATE_VERIFY) ||
      !CBB_add_u16(&body, hs->signature_algorithm)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return ssl_private_key_failure;
  }

  CBB child;
  const size_t max_sig_len = EVP_PKEY_size(hs->credential->pubkey.get());
  uint8_t *sig;
  size_t sig_len;
  if (!CBB_add_u16_length_prefixed(&body, &child) ||
      !CBB_reserve(&child, &sig, max_sig_len)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
    return ssl_private_key_failure;
  }

  Array<uint8_t> msg;
  if (!tls13_get_cert_verify_signature_input(
          hs, &msg,
          ssl->server ? ssl_cert_verify_server : ssl_cert_verify_client)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
    return ssl_private_key_failure;
  }

  enum ssl_private_key_result_t sign_result = ssl_private_key_sign(
      hs, sig, &sig_len, max_sig_len, hs->signature_algorithm, msg);
  if (sign_result != ssl_private_key_success) {
    return sign_result;
  }

  if (!CBB_did_write(&child, sig_len) ||  //
      !ssl_add_message_cbb(ssl, cbb.get())) {
    return ssl_private_key_failure;
  }

  return ssl_private_key_success;
}